

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[9],timeval,char>(JObject *this,char (*k) [9],timeval *v,char *c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[9],_timeval> field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [9])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (timeval *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[9],_timeval>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }